

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_reader.c
# Opt level: O3

int dlep_reader_map_identity
              (oonf_layer2_data *data,oonf_layer2_metadata *meta,dlep_session *session,
              uint16_t dlep_tlv,uint64_t scaling)

{
  ushort uVar1;
  uint uVar2;
  uint8_t *puVar3;
  int iVar4;
  dlep_parser_value *pdVar5;
  ulong uVar6;
  
  pdVar5 = dlep_session_get_tlv_value(session,dlep_tlv);
  iVar4 = 0;
  if (pdVar5 != (dlep_parser_value *)0x0) {
    iVar4 = -1;
    if (pdVar5->length - 1 < 8) {
      puVar3 = (session->parser).tlv_ptr;
      uVar1 = pdVar5->index;
      switch((uint)pdVar5->length) {
      case 1:
        uVar6 = (ulong)(char)puVar3[uVar1];
        break;
      case 2:
        uVar6 = (ulong)(short)(*(ushort *)(puVar3 + uVar1) << 8 | *(ushort *)(puVar3 + uVar1) >> 8);
        break;
      default:
        goto switchD_00109b1b_caseD_3;
      case 4:
        uVar2 = *(uint *)(puVar3 + uVar1);
        uVar6 = (ulong)(int)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                            uVar2 << 0x18);
        break;
      case 8:
        uVar6 = *(ulong *)(puVar3 + uVar1);
        uVar6 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28 |
                uVar6 << 0x38;
      }
      if (meta->type == OONF_LAYER2_BOOLEAN_DATA) {
        oonf_layer2_data_set(data,session->l2_origin,meta);
      }
      else {
        if (meta->type != OONF_LAYER2_INTEGER_DATA) {
          return -1;
        }
        oonf_layer2_data_set_int64(data,session->l2_origin,meta,uVar6,scaling);
      }
      iVar4 = 0;
    }
  }
switchD_00109b1b_caseD_3:
  return iVar4;
}

Assistant:

int
dlep_reader_map_identity(struct oonf_layer2_data *data, const struct oonf_layer2_metadata *meta,
  struct dlep_session *session, uint16_t dlep_tlv, uint64_t scaling) {
  struct dlep_parser_value *value;
  int64_t l2value;
  uint64_t tmp64;
  uint32_t tmp32;
  uint16_t tmp16;
  uint8_t tmp8;
  const uint8_t *dlepvalue;

  value = dlep_session_get_tlv_value(session, dlep_tlv);
  if (value) {
    dlepvalue = dlep_parser_get_tlv_binary(&session->parser, value);

    switch (value->length) {
      case 8:
        memcpy(&tmp64, dlepvalue, 8);
        l2value = (int64_t)be64toh(tmp64);
        break;
      case 4:
        memcpy(&tmp32, dlepvalue, 4);
        l2value = (int32_t)ntohl(tmp32);
        break;
      case 2:
        memcpy(&tmp16, dlepvalue, 2);
        l2value = (int16_t)ntohs(tmp16);
        break;
      case 1:
        memcpy(&tmp8, dlepvalue, 1);
        l2value = (int8_t)tmp8;
        break;
      default:
        return -1;
    }

    switch (meta->type) {
      case OONF_LAYER2_INTEGER_DATA:
        oonf_layer2_data_set_int64(data, session->l2_origin, meta, l2value, scaling);
        break;
      case OONF_LAYER2_BOOLEAN_DATA:
        oonf_layer2_data_set_bool(data, session->l2_origin, meta, l2value != 0);
        break;
      default:
        return -1;
    }
  }
  return 0;
}